

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynom.cpp
# Opt level: O3

pair<Polynom<Rational>,_Polynom<Rational>_> * __thiscall
Polynom<Rational>::ordinalDiv
          (pair<Polynom<Rational>,_Polynom<Rational>_> *__return_storage_ptr__,
          Polynom<Rational> *this,Polynom<Rational> *a)

{
  uint uVar1;
  uint uVar2;
  Rational *pRVar3;
  Rational *pRVar4;
  pointer puVar5;
  undefined8 uVar6;
  bool bVar7;
  compare_t cVar8;
  ulong uVar9;
  matrix_error *this_00;
  pointer *ppuVar10;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  BigInteger *this_01;
  long lVar14;
  Polynom<Rational> rem;
  Matrix<Rational> m;
  BigInteger l;
  BigInteger r;
  Polynom<Rational> res_1;
  Polynom<Rational> res;
  BigInteger local_158;
  BigInteger local_138;
  pair<Polynom<Rational>,_Polynom<Rational>_> *local_110;
  undefined1 local_108 [16];
  BigInteger local_f8;
  Polynom<Rational> *local_d8;
  BigInteger local_d0;
  BigInteger local_b0;
  BigInteger local_90;
  ulong local_70;
  ulong local_68;
  Matrix<Rational> local_60;
  BigInteger local_50;
  
  local_110 = __return_storage_ptr__;
  bVar7 = isOrdinal(this);
  if ((bVar7) && (bVar7 = isOrdinal(a), bVar7)) {
    uVar1 = (a->m).N;
    uVar9 = (ulong)uVar1;
    if (uVar9 != 0) {
      pRVar3 = (a->m).arr;
      ppuVar10 = &(pRVar3->_numerator).digits.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      uVar12 = uVar9;
      do {
        if (((_Vector_impl_data *)(ppuVar10 + -1))->_M_start != *ppuVar10) {
          if (0 < (int)uVar12) {
            uVar2 = (this->m).N;
            if ((ulong)uVar2 == 0) goto LAB_0013ea5b;
            pRVar4 = (this->m).arr;
            uVar11 = -uVar2;
            lVar14 = 0;
            goto LAB_0013ea11;
          }
          break;
        }
        ppuVar10 = ppuVar10 + 8;
        uVar12 = uVar12 - 1;
      } while (uVar12 != 0);
    }
    this_00 = (matrix_error *)__cxa_allocate_exception(0x10);
    matrix_error::runtime_error(this_00,"Ordinal division by zero");
  }
  else {
    this_00 = (matrix_error *)__cxa_allocate_exception(0x10);
    matrix_error::runtime_error(this_00,"Invalid ordinal");
  }
  __cxa_throw(this_00,&matrix_error::typeinfo,std::runtime_error::~runtime_error);
  while( true ) {
    uVar11 = uVar11 + 1;
    lVar14 = lVar14 + 0x40;
    if ((ulong)uVar2 << 6 == lVar14) break;
LAB_0013ea11:
    if (*(long *)((long)&(pRVar4->_numerator).digits.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar14) !=
        *(long *)((long)&(pRVar4->_numerator).digits.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish + lVar14)) {
      if ((int)uVar11 < 0) {
        ppuVar10 = &(pRVar3->_numerator).digits.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        uVar12 = 0;
        goto LAB_0013ea37;
      }
      break;
    }
  }
  goto LAB_0013ea5b;
  while( true ) {
    ::operator+(&local_158,(BigInteger *)(local_108 + 0x10),&local_d0);
    BigInteger::BigInteger(&local_b0,2);
    ::operator/(&local_90,&local_158,&local_b0);
    if (local_b0.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b0.digits.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_158.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_158.digits.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_158.digits,&local_90.digits);
    local_158.negative = local_90.negative;
    BigInteger::BigInteger(&local_138,1);
    uVar6 = local_108._8_8_;
    puVar5 = (((Rational *)(local_108._8_8_ + uVar9 * 0x40))->_numerator).digits.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    (((Rational *)(local_108._8_8_ + uVar9 * 0x40))->_numerator).digits.
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_start = local_158.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
    (((Rational *)(local_108._8_8_ + uVar9 * 0x40))->_numerator).digits.
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_158.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    (((Rational *)(local_108._8_8_ + uVar9 * 0x40))->_numerator).digits.
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         local_158.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_158.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_158.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_158.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (puVar5 != (pointer)0x0) {
      operator_delete(puVar5);
    }
    (((Rational *)(uVar6 + uVar9 * 0x40))->_numerator).negative = local_158.negative;
    puVar5 = (((Rational *)(uVar6 + uVar9 * 0x40))->_denominator).digits.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    (((Rational *)(uVar6 + uVar9 * 0x40))->_denominator).digits.
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_start = local_138.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
    (((Rational *)(uVar6 + uVar9 * 0x40))->_denominator).digits.
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_138.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    (((Rational *)(uVar6 + uVar9 * 0x40))->_denominator).digits.
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         local_138.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_138.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_138.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_138.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (puVar5 == (pointer)0x0) {
      (((Rational *)(uVar6 + uVar9 * 0x40))->_denominator).negative = local_138.negative;
    }
    else {
      operator_delete(puVar5);
      (((Rational *)(uVar6 + uVar9 * 0x40))->_denominator).negative = local_138.negative;
      if (local_138.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_138.digits.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
    if (local_158.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_158.digits.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    Polynom((Polynom<Rational> *)&local_158,(Matrix<Rational> *)local_108);
    ordinalMul((Polynom<Rational> *)&local_b0,local_d8);
    cVar8 = ordinalCmp(this,(Polynom<Rational> *)&local_b0);
    if (cVar8 == CMP_EQUAL) {
      Polynom((Polynom<Rational> *)&local_60);
      std::pair<Polynom<Rational>,_Polynom<Rational>_>::
      pair<Polynom<Rational>_&,_Polynom<Rational>,_true>
                (local_110,(Polynom<Rational> *)&local_158,(Polynom<Rational> *)&local_60);
      Matrix<Rational>::~Matrix(&local_60);
    }
    else if (cVar8 == CMP_LESS) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                (&local_d0.digits,&local_90.digits);
      local_d0.negative = local_90.negative;
    }
    else {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_108 + 0x10),
                 &local_90.digits);
      local_f8.negative = local_90.negative;
    }
    Matrix<Rational>::~Matrix((Matrix<Rational> *)&local_b0);
    Matrix<Rational>::~Matrix((Matrix<Rational> *)&local_158);
    if (local_90.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_90.digits.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (cVar8 == CMP_EQUAL) break;
LAB_0013ecf6:
    BigInteger::BigInteger(&local_90,1);
    ::operator+(&local_158,(BigInteger *)(local_108 + 0x10),&local_90);
    cVar8 = BigInteger::_compare(&local_158,&local_d0);
    if (local_158.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_158.digits.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_90.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_90.digits.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (cVar8 != CMP_LESS) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&local_158.digits,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_108 + 0x10));
      local_158.negative = local_f8.negative;
      BigInteger::BigInteger(&local_138,1);
      uVar6 = local_108._8_8_;
      puVar5 = (((Rational *)(local_108._8_8_ + uVar9 * 0x40))->_numerator).digits.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      (((Rational *)(local_108._8_8_ + uVar9 * 0x40))->_numerator).digits.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_158.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
      (((Rational *)(local_108._8_8_ + uVar9 * 0x40))->_numerator).digits.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_158.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      (((Rational *)(local_108._8_8_ + uVar9 * 0x40))->_numerator).digits.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_158.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_158.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_158.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_158.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (puVar5 != (pointer)0x0) {
        operator_delete(puVar5);
      }
      (((Rational *)(uVar6 + uVar9 * 0x40))->_numerator).negative = local_158.negative;
      puVar5 = (((Rational *)(uVar6 + uVar9 * 0x40))->_denominator).digits.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      (((Rational *)(uVar6 + uVar9 * 0x40))->_denominator).digits.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_138.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
      (((Rational *)(uVar6 + uVar9 * 0x40))->_denominator).digits.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_138.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      (((Rational *)(uVar6 + uVar9 * 0x40))->_denominator).digits.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_138.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_138.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_138.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_138.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (puVar5 == (pointer)0x0) {
        (((Rational *)(uVar6 + uVar9 * 0x40))->_denominator).negative = local_138.negative;
      }
      else {
        operator_delete(puVar5);
        (((Rational *)(uVar6 + uVar9 * 0x40))->_denominator).negative = local_138.negative;
        if (local_138.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
            .super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_138.digits.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
      }
      if (local_158.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_158.digits.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      bVar7 = true;
      goto LAB_0013f025;
    }
  }
  bVar7 = false;
LAB_0013f025:
  if (local_d0.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d0.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_f8.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (!bVar7) goto LAB_0013f0f6;
  uVar9 = local_68 + 1;
  if (local_70 <= local_68) goto LAB_0013f068;
  goto LAB_0013ead5;
LAB_0013f068:
  Polynom((Polynom<Rational> *)&local_d0,(Matrix<Rational> *)local_108);
  ordinalMul((Polynom<Rational> *)(local_108 + 0x10),local_d8);
  ordinalSub((Polynom<Rational> *)&local_158,this);
  Matrix<Rational>::~Matrix((Matrix<Rational> *)(local_108 + 0x10));
  Matrix<Rational>::~Matrix((Matrix<Rational> *)&local_d0);
  Polynom((Polynom<Rational> *)(local_108 + 0x10),(Matrix<Rational> *)local_108);
  std::pair<Polynom<Rational>,_Polynom<Rational>_>::
  pair<Polynom<Rational>,_Polynom<Rational>_&,_true>
            (local_110,(Polynom<Rational> *)(local_108 + 0x10),(Polynom<Rational> *)&local_158);
  Matrix<Rational>::~Matrix((Matrix<Rational> *)(local_108 + 0x10));
  Matrix<Rational>::~Matrix((Matrix<Rational> *)&local_158);
LAB_0013f0f6:
  this_01 = (BigInteger *)local_108;
  goto LAB_0013ea7f;
  while( true ) {
    uVar12 = uVar12 + 1;
    ppuVar10 = ppuVar10 + 8;
    if (uVar9 == uVar12) break;
LAB_0013ea37:
    if (((_Vector_impl_data *)(ppuVar10 + -1))->_M_start != *ppuVar10) {
      iVar13 = ~(uint)uVar12 + uVar1;
      goto LAB_0013ea57;
    }
  }
  iVar13 = -1;
LAB_0013ea57:
  if (iVar13 <= (int)~uVar11) {
    local_d8 = a;
    Matrix<Rational>::Matrix((Matrix<Rational> *)local_108,1,-uVar11);
    local_70 = (ulong)~uVar11;
    uVar9 = 0;
LAB_0013ead5:
    BigInteger::BigInteger((BigInteger *)(local_108 + 0x10),0);
    BigInteger::BigInteger(&local_d0,1);
    local_68 = uVar9;
    while( true ) {
      BigInteger::BigInteger(&local_b0,1);
      ::operator-(&local_90,&local_d0,&local_b0);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&local_158.digits,&local_90.digits);
      local_158.negative = local_90.negative;
      BigInteger::BigInteger(&local_138,1);
      uVar6 = local_108._8_8_;
      puVar5 = (((Rational *)(local_108._8_8_ + uVar9 * 0x40))->_numerator).digits.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      (((Rational *)(local_108._8_8_ + uVar9 * 0x40))->_numerator).digits.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_158.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
      (((Rational *)(local_108._8_8_ + uVar9 * 0x40))->_numerator).digits.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_158.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      (((Rational *)(local_108._8_8_ + uVar9 * 0x40))->_numerator).digits.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_158.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_158.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_158.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_158.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (puVar5 != (pointer)0x0) {
        operator_delete(puVar5);
      }
      (((Rational *)(uVar6 + uVar9 * 0x40))->_numerator).negative = local_158.negative;
      puVar5 = (((Rational *)(uVar6 + uVar9 * 0x40))->_denominator).digits.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      (((Rational *)(uVar6 + uVar9 * 0x40))->_denominator).digits.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_138.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
      (((Rational *)(uVar6 + uVar9 * 0x40))->_denominator).digits.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_138.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      (((Rational *)(uVar6 + uVar9 * 0x40))->_denominator).digits.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_138.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_138.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_138.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_138.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (puVar5 == (pointer)0x0) {
        (((Rational *)(uVar6 + uVar9 * 0x40))->_denominator).negative = local_138.negative;
      }
      else {
        operator_delete(puVar5);
        (((Rational *)(uVar6 + uVar9 * 0x40))->_denominator).negative = local_138.negative;
        if (local_138.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
            .super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_138.digits.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
      }
      if (local_158.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_158.digits.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_90.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_90.digits.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_b0.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b0.digits.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      Polynom((Polynom<Rational> *)&local_158,(Matrix<Rational> *)local_108);
      ordinalMul((Polynom<Rational> *)&local_90,local_d8);
      cVar8 = ordinalCmp(this,(Polynom<Rational> *)&local_90);
      if (cVar8 == CMP_LESS) {
        Matrix<Rational>::~Matrix((Matrix<Rational> *)&local_90);
        Matrix<Rational>::~Matrix((Matrix<Rational> *)&local_158);
        goto LAB_0013ecf6;
      }
      if (cVar8 == CMP_EQUAL) break;
      Matrix<Rational>::~Matrix((Matrix<Rational> *)&local_90);
      Matrix<Rational>::~Matrix((Matrix<Rational> *)&local_158);
      BigInteger::BigInteger(&local_50,2);
      BigInteger::operator*=(&local_d0,&local_50);
      if (local_50.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_50.digits.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
    Polynom((Polynom<Rational> *)&local_b0);
    std::pair<Polynom<Rational>,_Polynom<Rational>_>::
    pair<Polynom<Rational>_&,_Polynom<Rational>,_true>
              (local_110,(Polynom<Rational> *)&local_158,(Polynom<Rational> *)&local_b0);
    Matrix<Rational>::~Matrix((Matrix<Rational> *)&local_b0);
    Matrix<Rational>::~Matrix((Matrix<Rational> *)&local_90);
    Matrix<Rational>::~Matrix((Matrix<Rational> *)&local_158);
    bVar7 = false;
    goto LAB_0013f025;
  }
LAB_0013ea5b:
  Polynom((Polynom<Rational> *)&local_158);
  std::pair<Polynom<Rational>,_Polynom<Rational>_>::pair<Polynom<Rational>,_true>
            (local_110,(Polynom<Rational> *)&local_158,this);
  this_01 = &local_158;
LAB_0013ea7f:
  Matrix<Rational>::~Matrix((Matrix<Rational> *)this_01);
  return local_110;
}

Assistant:

const std::pair<Polynom<Field>, Polynom<Field>> Polynom<Field>::ordinalDiv(const Polynom &a) const
{
    if(!isOrdinal() || !a.isOrdinal())
        throw matrix_error("Invalid ordinal");
    if(a.degree() < 0)
        throw matrix_error("Ordinal division by zero");
    int d = degree();
    if(d < 0 || d < a.degree())
        return {Polynom(), *this};
    Matrix<Field> m(1, d + 1);
    for(int coeff = 0; coeff < d + 1; ++coeff)
    {
        BigInteger l = 0, r = 1;
        for(;; r *= 2)
        {
            m[0][coeff] = r - 1;
            Polynom t(m);
            Polynom res = a.ordinalMul(t);
            compare_t cmp = ordinalCmp(res);
            if(cmp == CMP_EQUAL)
                return {t, Polynom()};
            if(cmp == CMP_LESS)
                break;
        }
        while(l + 1 < r)
        {
            BigInteger mid = (l + r) / 2;
            m[0][coeff] = mid;
            Polynom t(m);
            Polynom res = a.ordinalMul(t);
            compare_t cmp = ordinalCmp(res);
            if(cmp == CMP_EQUAL)
                return {t, Polynom()};
            if(cmp == CMP_LESS)
                r = mid;
            else
                l = mid;
        }
        m[0][coeff] = l;
    }
    Polynom rem = ordinalSub(a.ordinalMul(Polynom(m)));
    return {Polynom(m), rem};
}